

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxReEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sel,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *maxabs,SPxId *id,int nr,bool polish)

{
  bool bVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar3;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar4;
  Item *pIVar5;
  pointer pnVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int32_t iVar9;
  long lVar10;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar11;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar16;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar17;
  pointer pnVar18;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar19;
  uint *puVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  pointer pnVar24;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar25;
  cpp_dec_float<200U,_int,_void> *pcVar26;
  pointer pnVar27;
  byte bVar28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_278;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_258;
  cpp_dec_float<200U,_int,_void> *local_1d0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1c8;
  long local_1c0;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar28 = 0;
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 0x1c;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  pSVar2 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pUVar3 = pSVar2->thePvec;
  pUVar4 = pSVar2->theCoPvec;
  iVar13 = (id->super_DataKey).info * pSVar2->theRep;
  if (iVar13 < 0) {
    if (0 < pSVar2->theRep *
            ((pSVar2->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.costat)->data[nr]) {
      this_00 = &pUVar4->thedelta;
      goto LAB_005cdd59;
    }
    pVVar16 = pSVar2->theCoUbound;
    local_278 = pSVar2->theCoLbound;
    pnVar6 = (pUVar4->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar20 = (uint *)(pnVar6 + nr);
    pcVar22 = &local_b8;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pcVar22->data)._M_elems[0] = *puVar20;
      puVar20 = puVar20 + 1;
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)((pcVar22->data)._M_elems + 1);
    }
    local_b8.exp = *(int *)((long)(pnVar6 + nr) + 0x70);
    local_b8.neg = *(bool *)((long)(pnVar6 + nr) + 0x74);
    local_b8._120_8_ = *(undefined8 *)((long)(pnVar6 + nr) + 0x78);
    pnVar6 = (pUVar4->thedelta).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar13 = pnVar6[nr].m_backend.exp;
    bVar1 = pnVar6[nr].m_backend.neg;
    uVar8._0_4_ = pnVar6[nr].m_backend.fpclass;
    uVar8._4_4_ = pnVar6[nr].m_backend.prec_elem;
    local_1d0 = &maxabs->m_backend;
    memmove(&local_138,pnVar6 + nr,0x70);
    local_138.exp = iVar13;
    local_138.neg = bVar1;
    local_138._120_8_ = uVar8;
    if ((fpclass_type)uVar8 == cpp_dec_float_NaN) {
LAB_005cdfe7:
      pVVar11 = pVVar16;
    }
    else {
      local_1b8.fpclass = cpp_dec_float_finite;
      local_1b8.prec_elem = 0x1c;
      local_1b8.data._M_elems[0] = 0;
      local_1b8.data._M_elems[1] = 0;
      local_1b8.data._M_elems[2] = 0;
      local_1b8.data._M_elems[3] = 0;
      local_1b8.data._M_elems[4] = 0;
      local_1b8.data._M_elems[5] = 0;
      local_1b8.data._M_elems[6] = 0;
      local_1b8.data._M_elems[7] = 0;
      local_1b8.data._M_elems[8] = 0;
      local_1b8.data._M_elems[9] = 0;
      local_1b8.data._M_elems[10] = 0;
      local_1b8.data._M_elems[0xb] = 0;
      local_1b8.data._M_elems[0xc] = 0;
      local_1b8.data._M_elems[0xd] = 0;
      local_1b8.data._M_elems[0xe] = 0;
      local_1b8.data._M_elems[0xf] = 0;
      local_1b8.data._M_elems[0x10] = 0;
      local_1b8.data._M_elems[0x11] = 0;
      local_1b8.data._M_elems[0x12] = 0;
      local_1b8.data._M_elems[0x13] = 0;
      local_1b8.data._M_elems[0x14] = 0;
      local_1b8.data._M_elems[0x15] = 0;
      local_1b8.data._M_elems[0x16] = 0;
      local_1b8.data._M_elems[0x17] = 0;
      local_1b8.data._M_elems[0x18] = 0;
      local_1b8.data._M_elems[0x19] = 0;
      local_1b8.data._M_elems._104_5_ = 0;
      local_1b8.data._M_elems[0x1b]._1_3_ = 0;
      local_1b8.exp = 0;
      local_1b8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_1b8,0.0);
      iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&local_138,&local_1b8);
      pVVar11 = local_278;
      if (-1 < iVar13) goto LAB_005cdfe7;
    }
    pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pVVar11->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + nr);
    pNVar17 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pUVar4->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + nr);
    local_258.val.m_backend.fpclass = cpp_dec_float_finite;
    local_258.val.m_backend.prec_elem = 0x1c;
    local_258.val.m_backend.data._M_elems[0] = 0;
    local_258.val.m_backend.data._M_elems[1] = 0;
    local_258.val.m_backend.data._M_elems[2] = 0;
    local_258.val.m_backend.data._M_elems[3] = 0;
    local_258.val.m_backend.data._M_elems[4] = 0;
    local_258.val.m_backend.data._M_elems[5] = 0;
    local_258.val.m_backend.data._M_elems[6] = 0;
    local_258.val.m_backend.data._M_elems[7] = 0;
    local_258.val.m_backend.data._M_elems[8] = 0;
    local_258.val.m_backend.data._M_elems[9] = 0;
    local_258.val.m_backend.data._M_elems[10] = 0;
    local_258.val.m_backend.data._M_elems[0xb] = 0;
    local_258.val.m_backend.data._M_elems[0xc] = 0;
    local_258.val.m_backend.data._M_elems[0xd] = 0;
    local_258.val.m_backend.data._M_elems[0xe] = 0;
    local_258.val.m_backend.data._M_elems[0xf] = 0;
    local_258.val.m_backend.data._M_elems[0x10] = 0;
    local_258.val.m_backend.data._M_elems[0x11] = 0;
    local_258.val.m_backend.data._M_elems[0x12] = 0;
    local_258.val.m_backend.data._M_elems[0x13] = 0;
    local_258.val.m_backend.data._M_elems[0x14] = 0;
    local_258.val.m_backend.data._M_elems[0x15] = 0;
    local_258.val.m_backend.data._M_elems[0x16] = 0;
    local_258.val.m_backend.data._M_elems[0x17] = 0;
    local_258.val.m_backend.data._M_elems[0x18] = 0;
    local_258.val.m_backend.data._M_elems[0x19] = 0;
    local_258.val.m_backend.data._M_elems._104_5_ = 0;
    local_258.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    local_258.val.m_backend.exp = 0;
    local_258.val.m_backend.neg = false;
    if (&local_258 == pNVar17) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                ((cpp_dec_float<200U,_int,_void> *)&local_258,
                 (cpp_dec_float<200U,_int,_void> *)pNVar12);
      if (local_258.val.m_backend.data._M_elems[0] != 0 ||
          local_258.val.m_backend.fpclass != cpp_dec_float_finite) {
        local_258.val.m_backend.neg = (bool)(local_258.val.m_backend.neg ^ 1);
      }
    }
    else {
      if (&local_258 != pNVar12) {
        pNVar19 = pNVar12;
        pNVar25 = &local_258;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pNVar25->val).m_backend.data._M_elems[0] = (pNVar19->val).m_backend.data._M_elems[0];
          pNVar19 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar19 + (ulong)bVar28 * -8 + 4);
          pNVar25 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar25 + (ulong)bVar28 * -8 + 4);
        }
        local_258.val.m_backend.exp = *(int *)((long)&(pNVar12->val).m_backend + 0x70);
        local_258.val.m_backend.neg = *(bool *)((long)&(pNVar12->val).m_backend + 0x74);
        local_258.val.m_backend._120_8_ = *(undefined8 *)((long)&(pNVar12->val).m_backend + 0x78);
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                ((cpp_dec_float<200U,_int,_void> *)&local_258,
                 (cpp_dec_float<200U,_int,_void> *)pNVar17);
    }
    local_1b8.fpclass = cpp_dec_float_finite;
    local_1b8.prec_elem = 0x1c;
    local_1b8.data._M_elems[0] = 0;
    local_1b8.data._M_elems[1] = 0;
    local_1b8.data._M_elems[2] = 0;
    local_1b8.data._M_elems[3] = 0;
    local_1b8.data._M_elems[4] = 0;
    local_1b8.data._M_elems[5] = 0;
    local_1b8.data._M_elems[6] = 0;
    local_1b8.data._M_elems[7] = 0;
    local_1b8.data._M_elems[8] = 0;
    local_1b8.data._M_elems[9] = 0;
    local_1b8.data._M_elems[10] = 0;
    local_1b8.data._M_elems[0xb] = 0;
    local_1b8.data._M_elems[0xc] = 0;
    local_1b8.data._M_elems[0xd] = 0;
    local_1b8.data._M_elems[0xe] = 0;
    local_1b8.data._M_elems[0xf] = 0;
    local_1b8.data._M_elems[0x10] = 0;
    local_1b8.data._M_elems[0x11] = 0;
    local_1b8.data._M_elems[0x12] = 0;
    local_1b8.data._M_elems[0x13] = 0;
    local_1b8.data._M_elems[0x14] = 0;
    local_1b8.data._M_elems[0x15] = 0;
    local_1b8.data._M_elems[0x16] = 0;
    local_1b8.data._M_elems[0x17] = 0;
    local_1b8.data._M_elems[0x18] = 0;
    local_1b8.data._M_elems[0x19] = 0;
    local_1b8.data._M_elems._104_5_ = 0;
    local_1b8.data._M_elems[0x1b]._1_3_ = 0;
    local_1b8.exp = 0;
    local_1b8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_1b8,(cpp_dec_float<200U,_int,_void> *)&local_258,&local_138);
    pcVar22 = &local_1b8;
    pnVar21 = sel;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar21->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar28 * -8 + 4);
      pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
    }
    (sel->m_backend).exp = local_1b8.exp;
    (sel->m_backend).neg = local_1b8.neg;
    (sel->m_backend).fpclass = local_1b8.fpclass;
    (sel->m_backend).prec_elem = local_1b8.prec_elem;
    goto LAB_005ce24a;
  }
  if (iVar13 == 0) {
    return true;
  }
  local_1c8 = &pUVar3->thedelta;
  local_1d0 = &maxabs->m_backend;
  pVVar16 = pSVar2->theUbound;
  local_278 = pSVar2->theLbound;
  pIVar5 = (pSVar2->thevectors->set).theitem;
  local_1c0 = (long)nr;
  iVar13 = (pSVar2->thevectors->set).thekey[nr].idx;
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 0x1c;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems[6] = 0;
  local_1b8.data._M_elems[7] = 0;
  local_1b8.data._M_elems[8] = 0;
  local_1b8.data._M_elems[9] = 0;
  local_1b8.data._M_elems[10] = 0;
  local_1b8.data._M_elems[0xb] = 0;
  local_1b8.data._M_elems[0xc] = 0;
  local_1b8.data._M_elems[0xd] = 0;
  local_1b8.data._M_elems[0xe] = 0;
  local_1b8.data._M_elems[0xf] = 0;
  local_1b8.data._M_elems[0x10] = 0;
  local_1b8.data._M_elems[0x11] = 0;
  local_1b8.data._M_elems[0x12] = 0;
  local_1b8.data._M_elems[0x13] = 0;
  local_1b8.data._M_elems[0x14] = 0;
  local_1b8.data._M_elems[0x15] = 0;
  local_1b8.data._M_elems[0x16] = 0;
  local_1b8.data._M_elems[0x17] = 0;
  local_1b8.data._M_elems[0x18] = 0;
  local_1b8.data._M_elems[0x19] = 0;
  local_1b8.data._M_elems._104_5_ = 0;
  local_1b8.data._M_elems[0x1b]._1_3_ = 0;
  local_1b8.exp = 0;
  local_1b8.neg = false;
  iVar15 = pIVar5[iVar13].data.
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .memused;
  if (0 < iVar15) {
    pNVar12 = pIVar5[iVar13].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    iVar15 = iVar15 + 1;
    do {
      pNVar19 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((pUVar4->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + pNVar12->idx);
      local_258.val.m_backend.fpclass = cpp_dec_float_finite;
      local_258.val.m_backend.prec_elem = 0x1c;
      local_258.val.m_backend.data._M_elems[0] = 0;
      local_258.val.m_backend.data._M_elems[1] = 0;
      local_258.val.m_backend.data._M_elems[2] = 0;
      local_258.val.m_backend.data._M_elems[3] = 0;
      local_258.val.m_backend.data._M_elems[4] = 0;
      local_258.val.m_backend.data._M_elems[5] = 0;
      local_258.val.m_backend.data._M_elems[6] = 0;
      local_258.val.m_backend.data._M_elems[7] = 0;
      local_258.val.m_backend.data._M_elems[8] = 0;
      local_258.val.m_backend.data._M_elems[9] = 0;
      local_258.val.m_backend.data._M_elems[10] = 0;
      local_258.val.m_backend.data._M_elems[0xb] = 0;
      local_258.val.m_backend.data._M_elems[0xc] = 0;
      local_258.val.m_backend.data._M_elems[0xd] = 0;
      local_258.val.m_backend.data._M_elems[0xe] = 0;
      local_258.val.m_backend.data._M_elems[0xf] = 0;
      local_258.val.m_backend.data._M_elems[0x10] = 0;
      local_258.val.m_backend.data._M_elems[0x11] = 0;
      local_258.val.m_backend.data._M_elems[0x12] = 0;
      local_258.val.m_backend.data._M_elems[0x13] = 0;
      local_258.val.m_backend.data._M_elems[0x14] = 0;
      local_258.val.m_backend.data._M_elems[0x15] = 0;
      local_258.val.m_backend.data._M_elems[0x16] = 0;
      local_258.val.m_backend.data._M_elems[0x17] = 0;
      local_258.val.m_backend.data._M_elems[0x18] = 0;
      local_258.val.m_backend.data._M_elems[0x19] = 0;
      local_258.val.m_backend.data._M_elems._104_5_ = 0;
      local_258.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      local_258.val.m_backend.exp = 0;
      local_258.val.m_backend.neg = false;
      pNVar17 = pNVar12;
      if ((&local_258 != pNVar19) && (pNVar17 = pNVar19, pNVar12 != &local_258)) {
        pNVar19 = pNVar12;
        pNVar25 = &local_258;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pNVar25->val).m_backend.data._M_elems[0] = (pNVar19->val).m_backend.data._M_elems[0];
          pNVar19 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar19 + (ulong)bVar28 * -8 + 4);
          pNVar25 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar25 + (ulong)bVar28 * -8 + 4);
        }
        local_258.val.m_backend.exp = (pNVar12->val).m_backend.exp;
        local_258.val.m_backend.neg = (pNVar12->val).m_backend.neg;
        local_258.val.m_backend.fpclass = (pNVar12->val).m_backend.fpclass;
        local_258.val.m_backend.prec_elem = (pNVar12->val).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                ((cpp_dec_float<200U,_int,_void> *)&local_258,
                 (cpp_dec_float<200U,_int,_void> *)pNVar17);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_1b8,(cpp_dec_float<200U,_int,_void> *)&local_258);
      pNVar12 = pNVar12 + 1;
      iVar15 = iVar15 + -1;
    } while (1 < iVar15);
  }
  pcVar22 = &local_1b8;
  pNVar12 = &local_258;
  for (lVar14 = 0x1c; lVar10 = local_1c0, lVar14 != 0; lVar14 = lVar14 + -1) {
    (pNVar12->val).m_backend.data._M_elems[0] = (pcVar22->data)._M_elems[0];
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar28 * -8 + 4);
    pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((long)pNVar12 + (ulong)bVar28 * -8 + 4);
  }
  pnVar6 = (pUVar3->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar12 = &local_258;
  pnVar18 = pnVar6 + local_1c0;
  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
    *(uint *)&pnVar18->m_backend = (pNVar12->val).m_backend.data._M_elems[0];
    pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((long)pNVar12 + (ulong)bVar28 * -8 + 4);
    pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar28 * -2 + 1) * 4);
  }
  *(int *)((long)(pnVar6 + local_1c0) + 0x70) = local_1b8.exp;
  *(bool *)((long)(pnVar6 + local_1c0) + 0x74) = local_1b8.neg;
  *(undefined8 *)((long)(pnVar6 + local_1c0) + 0x78) = local_1b8._120_8_;
  pSVar2 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  this_00 = local_1c8;
  if (0 < pSVar2->theRep *
          ((pSVar2->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.stat)->data[local_1c0]) {
LAB_005cdd59:
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clearIdx(this_00,nr);
    return true;
  }
  pnVar6 = (pUVar3->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar18 = pnVar6 + local_1c0;
  pcVar22 = &local_b8;
  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
    (pcVar22->data)._M_elems[0] = *(uint *)&pnVar18->m_backend;
    pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar28 * -2 + 1) * 4);
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar28 * -8 + 4);
  }
  local_b8.exp = *(int *)((long)(pnVar6 + local_1c0) + 0x70);
  local_b8.neg = *(bool *)((long)(pnVar6 + local_1c0) + 0x74);
  local_b8._120_8_ = *(undefined8 *)((long)(pnVar6 + local_1c0) + 0x78);
  pnVar6 = (pUVar3->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar13 = pnVar6[local_1c0].m_backend.exp;
  bVar1 = pnVar6[local_1c0].m_backend.neg;
  uVar7._0_4_ = pnVar6[local_1c0].m_backend.fpclass;
  uVar7._4_4_ = pnVar6[local_1c0].m_backend.prec_elem;
  memmove(&local_138,pnVar6 + local_1c0,0x70);
  local_138.exp = iVar13;
  local_138.neg = bVar1;
  local_138._120_8_ = uVar7;
  if ((fpclass_type)uVar7 == cpp_dec_float_NaN) {
LAB_005cde36:
    pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pVVar16->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar10);
    pNVar17 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pUVar3->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar10);
    if (&local_258 != pNVar17) goto LAB_005cde9d;
LAB_005ce1a7:
    local_258.val.m_backend.fpclass = cpp_dec_float_finite;
    local_258.val.m_backend.prec_elem = 0x1c;
    local_258.val.m_backend.neg = false;
    local_258.val.m_backend.exp = 0;
    local_258.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    local_258.val.m_backend.data._M_elems._104_5_ = 0;
    local_258.val.m_backend.data._M_elems[0x18] = 0;
    local_258.val.m_backend.data._M_elems[0x19] = 0;
    local_258.val.m_backend.data._M_elems[0x16] = 0;
    local_258.val.m_backend.data._M_elems[0x17] = 0;
    local_258.val.m_backend.data._M_elems[0x14] = 0;
    local_258.val.m_backend.data._M_elems[0x15] = 0;
    local_258.val.m_backend.data._M_elems[0x12] = 0;
    local_258.val.m_backend.data._M_elems[0x13] = 0;
    local_258.val.m_backend.data._M_elems[0x10] = 0;
    local_258.val.m_backend.data._M_elems[0x11] = 0;
    local_258.val.m_backend.data._M_elems[0xe] = 0;
    local_258.val.m_backend.data._M_elems[0xf] = 0;
    local_258.val.m_backend.data._M_elems[0xc] = 0;
    local_258.val.m_backend.data._M_elems[0xd] = 0;
    local_258.val.m_backend.data._M_elems[10] = 0;
    local_258.val.m_backend.data._M_elems[0xb] = 0;
    local_258.val.m_backend.data._M_elems[8] = 0;
    local_258.val.m_backend.data._M_elems[9] = 0;
    local_258.val.m_backend.data._M_elems[6] = 0;
    local_258.val.m_backend.data._M_elems[7] = 0;
    local_258.val.m_backend.data._M_elems[4] = 0;
    local_258.val.m_backend.data._M_elems[5] = 0;
    local_258.val.m_backend.data._M_elems[2] = 0;
    local_258.val.m_backend.data._M_elems[3] = 0;
    local_258.val.m_backend.data._M_elems[0] = 0;
    local_258.val.m_backend.data._M_elems[1] = 0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              ((cpp_dec_float<200U,_int,_void> *)&local_258,
               (cpp_dec_float<200U,_int,_void> *)pNVar12);
    if (local_258.val.m_backend.data._M_elems[0] != 0 ||
        local_258.val.m_backend.fpclass != cpp_dec_float_finite) {
      local_258.val.m_backend.neg = (bool)(local_258.val.m_backend.neg ^ 1);
    }
  }
  else {
    local_1b8.fpclass = cpp_dec_float_finite;
    local_1b8.prec_elem = 0x1c;
    local_1b8.data._M_elems[0] = 0;
    local_1b8.data._M_elems[1] = 0;
    local_1b8.data._M_elems[2] = 0;
    local_1b8.data._M_elems[3] = 0;
    local_1b8.data._M_elems[4] = 0;
    local_1b8.data._M_elems[5] = 0;
    local_1b8.data._M_elems[6] = 0;
    local_1b8.data._M_elems[7] = 0;
    local_1b8.data._M_elems[8] = 0;
    local_1b8.data._M_elems[9] = 0;
    local_1b8.data._M_elems[10] = 0;
    local_1b8.data._M_elems[0xb] = 0;
    local_1b8.data._M_elems[0xc] = 0;
    local_1b8.data._M_elems[0xd] = 0;
    local_1b8.data._M_elems[0xe] = 0;
    local_1b8.data._M_elems[0xf] = 0;
    local_1b8.data._M_elems[0x10] = 0;
    local_1b8.data._M_elems[0x11] = 0;
    local_1b8.data._M_elems[0x12] = 0;
    local_1b8.data._M_elems[0x13] = 0;
    local_1b8.data._M_elems[0x14] = 0;
    local_1b8.data._M_elems[0x15] = 0;
    local_1b8.data._M_elems[0x16] = 0;
    local_1b8.data._M_elems[0x17] = 0;
    local_1b8.data._M_elems[0x18] = 0;
    local_1b8.data._M_elems[0x19] = 0;
    local_1b8.data._M_elems._104_5_ = 0;
    local_1b8.data._M_elems[0x1b]._1_3_ = 0;
    local_1b8.exp = 0;
    local_1b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_1b8,0.0);
    iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_138,&local_1b8);
    if (-1 < iVar13) goto LAB_005cde36;
    pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((local_278->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar10);
    pNVar17 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pUVar3->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar10);
    if (&local_258 == pNVar17) goto LAB_005ce1a7;
LAB_005cde9d:
    local_258.val.m_backend.neg = false;
    local_258.val.m_backend.exp = 0;
    local_258.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    local_258.val.m_backend.data._M_elems._104_5_ = 0;
    local_258.val.m_backend.fpclass = cpp_dec_float_finite;
    local_258.val.m_backend.prec_elem = 0x1c;
    local_258.val.m_backend.data._M_elems[0x18] = 0;
    local_258.val.m_backend.data._M_elems[0x19] = 0;
    local_258.val.m_backend.data._M_elems[0x16] = 0;
    local_258.val.m_backend.data._M_elems[0x17] = 0;
    local_258.val.m_backend.data._M_elems[0x14] = 0;
    local_258.val.m_backend.data._M_elems[0x15] = 0;
    local_258.val.m_backend.data._M_elems[0x12] = 0;
    local_258.val.m_backend.data._M_elems[0x13] = 0;
    local_258.val.m_backend.data._M_elems[0x10] = 0;
    local_258.val.m_backend.data._M_elems[0x11] = 0;
    local_258.val.m_backend.data._M_elems[0xe] = 0;
    local_258.val.m_backend.data._M_elems[0xf] = 0;
    local_258.val.m_backend.data._M_elems[0xc] = 0;
    local_258.val.m_backend.data._M_elems[0xd] = 0;
    local_258.val.m_backend.data._M_elems[10] = 0;
    local_258.val.m_backend.data._M_elems[0xb] = 0;
    local_258.val.m_backend.data._M_elems[8] = 0;
    local_258.val.m_backend.data._M_elems[9] = 0;
    local_258.val.m_backend.data._M_elems[6] = 0;
    local_258.val.m_backend.data._M_elems[7] = 0;
    local_258.val.m_backend.data._M_elems[4] = 0;
    local_258.val.m_backend.data._M_elems[5] = 0;
    local_258.val.m_backend.data._M_elems[2] = 0;
    local_258.val.m_backend.data._M_elems[3] = 0;
    local_258.val.m_backend.data._M_elems[0] = 0;
    local_258.val.m_backend.data._M_elems[1] = 0;
    if (&local_258 != pNVar12) {
      pNVar19 = pNVar12;
      pNVar25 = &local_258;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pNVar25->val).m_backend.data._M_elems[0] = (pNVar19->val).m_backend.data._M_elems[0];
        pNVar19 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar19 + (ulong)bVar28 * -8 + 4);
        pNVar25 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar25 + (ulong)bVar28 * -8 + 4);
      }
      local_258.val.m_backend.exp = *(int *)((long)&(pNVar12->val).m_backend + 0x70);
      local_258.val.m_backend.neg = *(bool *)((long)&(pNVar12->val).m_backend + 0x74);
      local_258.val.m_backend._120_8_ = *(undefined8 *)((long)&(pNVar12->val).m_backend + 0x78);
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              ((cpp_dec_float<200U,_int,_void> *)&local_258,
               (cpp_dec_float<200U,_int,_void> *)pNVar17);
  }
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 0x1c;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems[6] = 0;
  local_1b8.data._M_elems[7] = 0;
  local_1b8.data._M_elems[8] = 0;
  local_1b8.data._M_elems[9] = 0;
  local_1b8.data._M_elems[10] = 0;
  local_1b8.data._M_elems[0xb] = 0;
  local_1b8.data._M_elems[0xc] = 0;
  local_1b8.data._M_elems[0xd] = 0;
  local_1b8.data._M_elems[0xe] = 0;
  local_1b8.data._M_elems[0xf] = 0;
  local_1b8.data._M_elems[0x10] = 0;
  local_1b8.data._M_elems[0x11] = 0;
  local_1b8.data._M_elems[0x12] = 0;
  local_1b8.data._M_elems[0x13] = 0;
  local_1b8.data._M_elems[0x14] = 0;
  local_1b8.data._M_elems[0x15] = 0;
  local_1b8.data._M_elems[0x16] = 0;
  local_1b8.data._M_elems[0x17] = 0;
  local_1b8.data._M_elems[0x18] = 0;
  local_1b8.data._M_elems[0x19] = 0;
  local_1b8.data._M_elems._104_5_ = 0;
  local_1b8.data._M_elems[0x1b]._1_3_ = 0;
  local_1b8.exp = 0;
  local_1b8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&local_1b8,(cpp_dec_float<200U,_int,_void> *)&local_258,&local_138);
  pcVar22 = &local_1b8;
  pnVar21 = sel;
  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
    (pnVar21->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar28 * -8 + 4);
    pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
  }
  (sel->m_backend).exp = local_1b8.exp;
  (sel->m_backend).neg = local_1b8.neg;
  (sel->m_backend).fpclass = local_1b8.fpclass;
  (sel->m_backend).prec_elem = local_1b8.prec_elem;
LAB_005ce24a:
  pnVar6 = (pVVar16->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((pnVar6[nr].m_backend.fpclass == cpp_dec_float_NaN) ||
      (pnVar18 = (local_278->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
      pnVar18[nr].m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&pnVar6[nr].m_backend,&pnVar18[nr].m_backend), iVar13 != 0)) {
    pnVar21 = &this->fastDelta;
    pNVar12 = &local_258;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pNVar12->val).m_backend.data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
      pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar21 + (ulong)bVar28 * -8 + 4);
      pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)pNVar12 + (ulong)bVar28 * -8 + 4);
    }
    local_258.val.m_backend.exp = (this->fastDelta).m_backend.exp;
    local_258.val.m_backend.neg = (this->fastDelta).m_backend.neg;
    local_258.val.m_backend.fpclass = (this->fastDelta).m_backend.fpclass;
    local_258.val.m_backend.prec_elem = (this->fastDelta).m_backend.prec_elem;
    if (local_258.val.m_backend.fpclass != cpp_dec_float_finite ||
        local_258.val.m_backend.data._M_elems[0] != 0) {
      local_258.val.m_backend.neg = (bool)(local_258.val.m_backend.neg ^ 1);
    }
    local_1b8.fpclass = cpp_dec_float_finite;
    local_1b8.prec_elem = 0x1c;
    local_1b8.data._M_elems[0] = 0;
    local_1b8.data._M_elems[1] = 0;
    local_1b8.data._M_elems[2] = 0;
    local_1b8.data._M_elems[3] = 0;
    local_1b8.data._M_elems[4] = 0;
    local_1b8.data._M_elems[5] = 0;
    local_1b8.data._M_elems[6] = 0;
    local_1b8.data._M_elems[7] = 0;
    local_1b8.data._M_elems[8] = 0;
    local_1b8.data._M_elems[9] = 0;
    local_1b8.data._M_elems[10] = 0;
    local_1b8.data._M_elems[0xb] = 0;
    local_1b8.data._M_elems[0xc] = 0;
    local_1b8.data._M_elems[0xd] = 0;
    local_1b8.data._M_elems[0xe] = 0;
    local_1b8.data._M_elems[0xf] = 0;
    local_1b8.data._M_elems[0x10] = 0;
    local_1b8.data._M_elems[0x11] = 0;
    local_1b8.data._M_elems[0x12] = 0;
    local_1b8.data._M_elems[0x13] = 0;
    local_1b8.data._M_elems[0x14] = 0;
    local_1b8.data._M_elems[0x15] = 0;
    local_1b8.data._M_elems[0x16] = 0;
    local_1b8.data._M_elems[0x17] = 0;
    local_1b8.data._M_elems[0x18] = 0;
    local_1b8.data._M_elems[0x19] = 0;
    local_1b8.data._M_elems._104_5_ = 0;
    local_1b8.data._M_elems[0x1b]._1_3_ = 0;
    local_1b8.exp = 0;
    local_1b8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_1b8,(cpp_dec_float<200U,_int,_void> *)&local_258,local_1d0);
    if ((((sel->m_backend).fpclass != cpp_dec_float_NaN) && (local_1b8.fpclass != cpp_dec_float_NaN)
        ) && ((iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&sel->m_backend,&local_1b8), iVar13 < 0 &&
              (boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                         ((cpp_dec_float<200u,int,void> *)sel,0.0), !polish)))) {
      if (local_138.fpclass != cpp_dec_float_NaN) {
        local_1b8.fpclass = cpp_dec_float_finite;
        local_1b8.prec_elem = 0x1c;
        local_1b8.data._M_elems[0] = 0;
        local_1b8.data._M_elems[1] = 0;
        local_1b8.data._M_elems[2] = 0;
        local_1b8.data._M_elems[3] = 0;
        local_1b8.data._M_elems[4] = 0;
        local_1b8.data._M_elems[5] = 0;
        local_1b8.data._M_elems[6] = 0;
        local_1b8.data._M_elems[7] = 0;
        local_1b8.data._M_elems[8] = 0;
        local_1b8.data._M_elems[9] = 0;
        local_1b8.data._M_elems[10] = 0;
        local_1b8.data._M_elems[0xb] = 0;
        local_1b8.data._M_elems[0xc] = 0;
        local_1b8.data._M_elems[0xd] = 0;
        local_1b8.data._M_elems[0xe] = 0;
        local_1b8.data._M_elems[0xf] = 0;
        local_1b8.data._M_elems[0x10] = 0;
        local_1b8.data._M_elems[0x11] = 0;
        local_1b8.data._M_elems[0x12] = 0;
        local_1b8.data._M_elems[0x13] = 0;
        local_1b8.data._M_elems[0x14] = 0;
        local_1b8.data._M_elems[0x15] = 0;
        local_1b8.data._M_elems[0x16] = 0;
        local_1b8.data._M_elems[0x17] = 0;
        local_1b8.data._M_elems[0x18] = 0;
        local_1b8.data._M_elems[0x19] = 0;
        local_1b8.data._M_elems._104_5_ = 0;
        local_1b8.data._M_elems[0x1b]._1_3_ = 0;
        local_1b8.exp = 0;
        local_1b8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_1b8,0.0);
        iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_138,&local_1b8);
        if (0 < iVar13) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&(((this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->theShift).m_backend,
                     &(pVVar16->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[nr].m_backend);
          pnVar6 = (pVVar16->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar22 = &local_b8;
          pnVar18 = pnVar6 + nr;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pnVar18->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar28 * -8 + 4);
            pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar28 * -2 + 1) * 4);
          }
          pnVar6[nr].m_backend.exp = local_b8.exp;
          pnVar6[nr].m_backend.neg = local_b8.neg;
          pnVar6[nr].m_backend.fpclass = local_b8.fpclass;
          pnVar6[nr].m_backend.prec_elem = local_b8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&(((this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->theShift).m_backend,
                     &(pVVar16->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[nr].m_backend);
          return false;
        }
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,
                 &(local_278->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[nr].m_backend);
      pnVar6 = (local_278->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar22 = &local_b8;
      pnVar18 = pnVar6 + nr;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar28 * -8 + 4);
        pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar28 * -2 + 1) * 4);
      }
      pnVar6[nr].m_backend.exp = local_b8.exp;
      pnVar6[nr].m_backend.neg = local_b8.neg;
      pnVar6[nr].m_backend.fpclass = local_b8.fpclass;
      pnVar6[nr].m_backend.prec_elem = local_b8.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,
                 &(local_278->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[nr].m_backend);
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)sel,0.0);
    if (!polish) {
      if (((local_b8.fpclass == cpp_dec_float_NaN) ||
          (pnVar6 = (pVVar16->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pnVar6[nr].m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_b8,&pnVar6[nr].m_backend), iVar13 < 1)) {
        pcVar22 = &(local_278->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[nr].m_backend;
        local_1b8.fpclass = cpp_dec_float_finite;
        local_1b8.prec_elem = 0x1c;
        local_1b8.data._M_elems[0] = 0;
        local_1b8.data._M_elems[1] = 0;
        local_1b8.data._M_elems[2] = 0;
        local_1b8.data._M_elems[3] = 0;
        local_1b8.data._M_elems[4] = 0;
        local_1b8.data._M_elems[5] = 0;
        local_1b8.data._M_elems[6] = 0;
        local_1b8.data._M_elems[7] = 0;
        local_1b8.data._M_elems[8] = 0;
        local_1b8.data._M_elems[9] = 0;
        local_1b8.data._M_elems[10] = 0;
        local_1b8.data._M_elems[0xb] = 0;
        local_1b8.data._M_elems[0xc] = 0;
        local_1b8.data._M_elems[0xd] = 0;
        local_1b8.data._M_elems[0xe] = 0;
        local_1b8.data._M_elems[0xf] = 0;
        local_1b8.data._M_elems[0x10] = 0;
        local_1b8.data._M_elems[0x11] = 0;
        local_1b8.data._M_elems[0x12] = 0;
        local_1b8.data._M_elems[0x13] = 0;
        local_1b8.data._M_elems[0x14] = 0;
        local_1b8.data._M_elems[0x15] = 0;
        local_1b8.data._M_elems[0x16] = 0;
        local_1b8.data._M_elems[0x17] = 0;
        local_1b8.data._M_elems[0x18] = 0;
        local_1b8.data._M_elems[0x19] = 0;
        local_1b8.data._M_elems._104_5_ = 0;
        local_1b8.data._M_elems[0x1b]._1_3_ = 0;
        local_1b8.exp = 0;
        local_1b8.neg = false;
        if (&local_1b8 != pcVar22) {
          pcVar23 = pcVar22;
          pcVar26 = &local_1b8;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar26->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar28 * -8 + 4);
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar28 * -8 + 4);
          }
          local_1b8.exp = pcVar22->exp;
          local_1b8.neg = pcVar22->neg;
          local_1b8.fpclass = pcVar22->fpclass;
          local_1b8.prec_elem = pcVar22->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_1b8,&local_b8);
        pSVar2 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
      }
      else {
        pcVar22 = &(pVVar16->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[nr].m_backend;
        local_1b8.fpclass = cpp_dec_float_finite;
        local_1b8.prec_elem = 0x1c;
        local_1b8.data._M_elems[0] = 0;
        local_1b8.data._M_elems[1] = 0;
        local_1b8.data._M_elems[2] = 0;
        local_1b8.data._M_elems[3] = 0;
        local_1b8.data._M_elems[4] = 0;
        local_1b8.data._M_elems[5] = 0;
        local_1b8.data._M_elems[6] = 0;
        local_1b8.data._M_elems[7] = 0;
        local_1b8.data._M_elems[8] = 0;
        local_1b8.data._M_elems[9] = 0;
        local_1b8.data._M_elems[10] = 0;
        local_1b8.data._M_elems[0xb] = 0;
        local_1b8.data._M_elems[0xc] = 0;
        local_1b8.data._M_elems[0xd] = 0;
        local_1b8.data._M_elems[0xe] = 0;
        local_1b8.data._M_elems[0xf] = 0;
        local_1b8.data._M_elems[0x10] = 0;
        local_1b8.data._M_elems[0x11] = 0;
        local_1b8.data._M_elems[0x12] = 0;
        local_1b8.data._M_elems[0x13] = 0;
        local_1b8.data._M_elems[0x14] = 0;
        local_1b8.data._M_elems[0x15] = 0;
        local_1b8.data._M_elems[0x16] = 0;
        local_1b8.data._M_elems[0x17] = 0;
        local_1b8.data._M_elems[0x18] = 0;
        local_1b8.data._M_elems[0x19] = 0;
        local_1b8.data._M_elems._104_5_ = 0;
        local_1b8.data._M_elems[0x1b]._1_3_ = 0;
        local_1b8.exp = 0;
        local_1b8.neg = false;
        if (&local_1b8 == pcVar22) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_1b8,&local_b8);
          if (local_1b8.data._M_elems[0] != 0 || local_1b8.fpclass != cpp_dec_float_finite) {
            local_1b8.neg = (bool)(local_1b8.neg ^ 1);
          }
        }
        else {
          pcVar23 = &local_b8;
          pcVar26 = &local_1b8;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar26->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar28 * -8 + 4);
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar28 * -8 + 4);
          }
          local_1b8.exp = local_b8.exp;
          local_1b8.neg = local_b8.neg;
          local_1b8.fpclass = local_b8.fpclass;
          local_1b8.prec_elem = local_b8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_1b8,pcVar22);
        }
        pSVar2 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&(pSVar2->theShift).m_backend,&local_1b8);
      pnVar6 = (local_278->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar22 = &local_b8;
      pnVar18 = pnVar6 + nr;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar28 * -8 + 4);
        pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar28 * -2 + 1) * 4);
      }
      pnVar6[nr].m_backend.exp = local_b8.exp;
      pnVar6[nr].m_backend.neg = local_b8.neg;
      pnVar6[nr].m_backend.fpclass = local_b8.fpclass;
      pnVar6[nr].m_backend.prec_elem = local_b8.prec_elem;
      pnVar18 = (pVVar16->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar24 = pnVar6 + nr;
      pnVar27 = pnVar18 + nr;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar27->m_backend).data._M_elems[0] = (pnVar24->m_backend).data._M_elems[0];
        pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar28 * -2 + 1) * 4);
        pnVar27 = (pointer)((long)pnVar27 + ((ulong)bVar28 * -2 + 1) * 4);
      }
      pnVar18[nr].m_backend.exp = pnVar6[nr].m_backend.exp;
      pnVar18[nr].m_backend.neg = pnVar6[nr].m_backend.neg;
      iVar9 = pnVar6[nr].m_backend.prec_elem;
      pnVar18[nr].m_backend.fpclass = pnVar6[nr].m_backend.fpclass;
      pnVar18[nr].m_backend.prec_elem = iVar9;
    }
  }
  return false;
}

Assistant:

bool SPxFastRT<R>::maxReEnter(R& sel,
                              R maxabs,
                              const SPxId& id,
                              int nr,
                              bool polish)
{
   R x, d;
   VectorBase<R>* up;
   VectorBase<R>* low;

   UpdateVector<R>& pvec = this->thesolver->pVec();
   SSVectorBase<R>& pupd = this->thesolver->pVec().delta();
   VectorBase<R>& upb = this->thesolver->upBound();
   VectorBase<R>& lpb = this->thesolver->lpBound();
   UpdateVector<R>& cvec = this->thesolver->coPvec();
   SSVectorBase<R>& cupd = this->thesolver->coPvec().delta();
   VectorBase<R>& ucb = this->thesolver->ucBound();
   VectorBase<R>& lcb = this->thesolver->lcBound();

   if(this->thesolver->isCoId(id))
   {
      if(this->thesolver->isCoBasic(nr))
      {
         cupd.clearIdx(nr);
         return true;
      }

      x = cvec[nr];
      d = cupd[nr];
      up = &ucb;
      low = &lcb;

      if(d < 0.0)
         sel = (lcb[nr] - cvec[nr]) / d;
      else
         sel = (ucb[nr] - cvec[nr]) / d;
   }
   else if(this->thesolver->isId(id))
   {
      pvec[nr] = this->thesolver->vector(nr) * cvec;

      if(this->thesolver->isBasic(nr))
      {
         pupd.clearIdx(nr);
         return true;
      }

      x = pvec[nr];
      d = pupd[nr];
      up = &upb;
      low = &lpb;

      if(d < 0.0)
         sel = (lpb[nr] - pvec[nr]) / d;
      else
         sel = (upb[nr] - pvec[nr]) / d;
   }
   else
      return true;

   if((*up)[nr] != (*low)[nr])
   {
      if(sel < -fastDelta / maxabs)
      {
         sel = 0.0;

         // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         if(!polish)
         {
            if(d > 0.0)
            {
               this->thesolver->theShift -= (*up)[nr];
               (*up)[nr] = x;
               this->thesolver->theShift += (*up)[nr];
            }
            else
            {
               this->thesolver->theShift += (*low)[nr];
               (*low)[nr] = x;
               this->thesolver->theShift -= (*low)[nr];
            }
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         if(x > (*up)[nr])
            this->thesolver->theShift += x - (*up)[nr];
         else
            this->thesolver->theShift += (*low)[nr] - x;

         (*up)[nr] = (*low)[nr] = x;
      }
   }

   return false;
}